

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.cc
# Opt level: O1

void __thiscall Monitor::print(Monitor *this,Stats *stats)

{
  float *pfVar1;
  int *piVar2;
  int *v_4;
  tm *__tp;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  int *piVar7;
  const_iterator __begin0;
  float *pfVar8;
  const_iterator __begin0_3;
  int iVar9;
  float r;
  float fVar10;
  float fVar11;
  double dVar12;
  time_t t;
  stringstream ss;
  array<char,_128UL> tsbuf;
  long *local_250;
  long local_248;
  long local_240 [2];
  time_t local_230;
  stringstream local_228 [16];
  long local_218;
  long local_210 [2];
  uint auStack_200 [22];
  ios_base local_1a8 [264];
  char local_a0 [128];
  
  fVar10 = log10f((float)(((this->interval_).__r / 1000) * 0x3c));
  fVar10 = ceilf(fVar10);
  local_230 = time((time_t *)0x0);
  __tp = gmtime(&local_230);
  strftime(local_a0,0x80,"%Y-%m-%dT%H:%M:%SZ",__tp);
  std::__cxx11::stringstream::stringstream(local_228);
  *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) =
       *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) & 0xfffffefb | 4;
  local_250 = local_240;
  sVar3 = strlen(local_a0);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,local_a0,local_a0 + sVar3);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_218,(char *)local_250,local_248);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," [monitor] ",0xb);
  if (local_250 != local_240) {
    operator_delete(local_250,local_240[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,"gain: ",6);
  *(undefined8 *)((long)local_210 + *(long *)(local_218 + -0x18)) = 2;
  *(undefined8 *)((long)local_210 + *(long *)(local_218 + -0x18) + 8) = 5;
  pfVar8 = (stats->gain).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar1 = (stats->gain).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)pfVar1 - (long)pfVar8;
  if (lVar5 == 0) {
    dVar12 = 0.0;
  }
  else {
    fVar11 = 0.0;
    do {
      fVar11 = fVar11 + *pfVar8;
      pfVar8 = pfVar8 + 1;
    } while (pfVar8 != pfVar1);
    dVar12 = (double)(fVar11 / (float)(ulong)(lVar5 >> 2));
  }
  poVar4 = std::ostream::_M_insert<double>(dVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,"freq: ",6);
  *(undefined8 *)((long)local_210 + *(long *)(local_218 + -0x18)) = 1;
  *(undefined8 *)((long)local_210 + *(long *)(local_218 + -0x18) + 8) = 7;
  pfVar8 = (stats->frequency).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar1 = (stats->frequency).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)pfVar1 - (long)pfVar8;
  if (lVar5 == 0) {
    dVar12 = 0.0;
  }
  else {
    fVar11 = 0.0;
    do {
      fVar11 = fVar11 + *pfVar8;
      pfVar8 = pfVar8 + 1;
    } while (pfVar8 != pfVar1);
    dVar12 = (double)(fVar11 / (float)(ulong)(lVar5 >> 2));
  }
  poVar4 = std::ostream::_M_insert<double>(dVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,"omega: ",7);
  *(undefined8 *)((long)local_210 + *(long *)(local_218 + -0x18)) = 3;
  *(undefined8 *)((long)local_210 + *(long *)(local_218 + -0x18) + 8) = 5;
  pfVar8 = (stats->omega).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar1 = (stats->omega).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)pfVar1 - (long)pfVar8;
  if (lVar5 == 0) {
    dVar12 = 0.0;
  }
  else {
    fVar11 = 0.0;
    do {
      fVar11 = fVar11 + *pfVar8;
      pfVar8 = pfVar8 + 1;
    } while (pfVar8 != pfVar1);
    dVar12 = (double)(fVar11 / (float)(ulong)(lVar5 >> 2));
  }
  poVar4 = std::ostream::_M_insert<double>(dVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,"vit(avg): ",10);
  *(undefined8 *)((long)local_210 + *(long *)(local_218 + -0x18) + 8) = 4;
  piVar7 = (stats->viterbiErrors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (stats->viterbiErrors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)piVar2 - (long)piVar7;
  if (lVar5 == 0) {
    iVar9 = 0;
  }
  else {
    uVar6 = 0;
    do {
      uVar6 = (long)(int)uVar6 + (long)*piVar7;
      piVar7 = piVar7 + 1;
    } while (piVar7 != piVar2);
    iVar9 = (int)(uVar6 / (ulong)(lVar5 >> 2));
  }
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_218,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,"rs(sum): ",9);
  *(undefined8 *)((long)local_210 + *(long *)(local_218 + -0x18) + 8) = 4;
  iVar9 = 0;
  for (piVar7 = (stats->reedSolomonErrors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar7 != (stats->reedSolomonErrors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar7 = piVar7 + 1) {
    iVar9 = iVar9 + *piVar7;
  }
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_218,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,"packets: ",9);
  *(long *)((long)local_210 + *(long *)(local_218 + -0x18) + 8) = (long)(int)fVar10;
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_218,stats->totalOK);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,"drops: ",7);
  *(long *)((long)local_210 + *(long *)(local_218 + -0x18) + 8) = (long)(int)fVar10;
  std::ostream::operator<<((ostream *)&local_218,stats->totalDropped);
  std::__cxx11::stringbuf::str();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_250,local_248);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_250 != local_240) {
    operator_delete(local_250,local_240[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_228);
  std::ios_base::~ios_base(local_1a8);
  return;
}

Assistant:

void Monitor::print(const Stats& stats) {
  auto sec = std::chrono::duration_cast<std::chrono::seconds>(interval_).count();

  // Upper bound of 60 packets per second (HRIT)
  const auto packetWidth = ceilf(log10f(sec * 60));

  // std::put_time is not available in GCC < 5
  std::time_t t = std::time(nullptr);
  std::array<char, 128> tsbuf;
  strftime(tsbuf.data(), tsbuf.size(), "%Y-%m-%dT%H:%M:%SZ", std::gmtime(&t));

  std::stringstream ss;
  ss << std::fixed;
  ss << std::string(tsbuf.data())
     << " [monitor] ";
  ss << "gain: "
     << std::setprecision(2) << std::setw(5)
     << avg(stats.gain) << ", ";
  ss << "freq: "
     << std::setprecision(1) << std::setw(7)
     << avg(stats.frequency) << ", ";
  ss << "omega: "
     << std::setprecision(3) << std::setw(5)
     << avg(stats.omega) << ", ";
  ss << "vit(avg): "
     << std::setw(4)
     << avg(stats.viterbiErrors) << ", ";
  ss << "rs(sum): "
     << std::setw(4)
     << sum(stats.reedSolomonErrors) << ", ";
  ss << "packets: "
     << std::setw(packetWidth)
     << stats.totalOK << ", ";
  ss << "drops: "
     << std::setw(packetWidth)
     << stats.totalDropped;
  std::cout << ss.str() << std::endl;
}